

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token __thiscall slang::syntax::SyntaxNode::childToken(SyntaxNode *this,size_t index)

{
  bool bVar1;
  SyntaxNode *in_RSI;
  Token TVar2;
  ConstTokenOrSyntax child;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc8;
  Token *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  undefined1 local_10 [16];
  
  getChild(in_RSI,in_stack_ffffffffffffffd8);
  bVar1 = ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)0x39bed8);
  if (bVar1) {
    local_10 = (undefined1  [16])ConstTokenOrSyntax::token(in_stack_ffffffffffffffc8);
  }
  else {
    parsing::Token::Token(in_stack_ffffffffffffffd0);
  }
  TVar2.kind = local_10._0_2_;
  TVar2._2_1_ = local_10[2];
  TVar2.numFlags.raw = local_10[3];
  TVar2.rawLen = local_10._4_4_;
  TVar2.info = (Info *)local_10._8_8_;
  return TVar2;
}

Assistant:

parsing::Token SyntaxNode::childToken(size_t index) const {
    auto child = getChild(index);
    if (!child.isToken())
        return Token();
    return child.token();
}